

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockets.cpp
# Opt level: O2

bool SendInt(int socket,int number)

{
  size_t sVar1;
  ssize_t sVar2;
  size_t __n;
  int number_local;
  
  sVar1 = 4;
  do {
    __n = sVar1;
    if (__n == 0) break;
    sVar2 = write(socket,&stack0xffffffffffffffe8 + -__n,__n);
    sVar1 = __n - sVar2;
  } while (0 < sVar2);
  return __n == 0;
}

Assistant:

bool SendInt(int socket, int number)
{
    char * data = (char*)&number;
    size_t left = sizeof(number);
    ssize_t rc;

    while (left)
    {
        rc = write(socket, data + sizeof(number) - left, left);
        if(rc <= 0) return false;
        left -= rc;
    }

    return true;
}